

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  Scene *pSVar4;
  Geometry *pGVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar20;
  byte bVar21;
  uint uVar22;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar23) [32];
  long lVar24;
  byte bVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  RTCIntersectArguments *pRVar30;
  size_t sVar31;
  ulong uVar32;
  ulong uVar33;
  bool bVar34;
  uint uVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined4 uVar76;
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  long lStack_2650;
  StackItemT<embree::NodeRefPtr<8>_> *local_2640;
  int local_2604;
  ulong local_2600;
  RayQueryContext *local_25f8;
  RTCIntersectArguments *local_25f0;
  long local_25e8;
  long local_25e0;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2578;
  undefined1 local_2518 [16];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 local_24d8 [16];
  float local_24c8 [4];
  undefined1 local_24b8 [32];
  undefined1 local_2498 [32];
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  float local_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  float fStack_23a0;
  float fStack_239c;
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_2640 = stack + 1;
    stack[0].dist = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar82 = (ray->super_RayK<1>).tfar;
    auVar75 = ZEXT464((uint)fVar82);
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar37 = vandps_avx512vl((undefined1  [16])aVar2,auVar37);
    auVar38._8_4_ = 0x219392ef;
    auVar38._0_8_ = 0x219392ef219392ef;
    auVar38._12_4_ = 0x219392ef;
    uVar12 = vcmpps_avx512vl(auVar37,auVar38,1);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar94 = ZEXT1664(auVar37);
    auVar37 = vdivps_avx512vl(auVar37,(undefined1  [16])aVar2);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar34 = (bool)((byte)uVar12 & 1);
    auVar47._0_4_ = (uint)bVar34 * auVar38._0_4_ | (uint)!bVar34 * auVar37._0_4_;
    bVar34 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar47._4_4_ = (uint)bVar34 * auVar38._4_4_ | (uint)!bVar34 * auVar37._4_4_;
    bVar34 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar47._8_4_ = (uint)bVar34 * auVar38._8_4_ | (uint)!bVar34 * auVar37._8_4_;
    bVar34 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar47._12_4_ = (uint)bVar34 * auVar38._12_4_ | (uint)!bVar34 * auVar37._12_4_;
    auVar55._8_4_ = 0x3f7ffffa;
    auVar55._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar55._12_4_ = 0x3f7ffffa;
    auVar39 = vmulps_avx512vl(auVar47,auVar55);
    auVar40._8_4_ = 0x3f800003;
    auVar40._0_8_ = 0x3f8000033f800003;
    auVar40._12_4_ = 0x3f800003;
    auVar40 = vmulps_avx512vl(auVar47,auVar40);
    local_2438 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar95 = ZEXT3264(local_2438);
    local_2458 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar96 = ZEXT3264(local_2458);
    auVar37 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar82));
    local_2478 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar97 = ZEXT3264(local_2478);
    local_2498 = vbroadcastss_avx512vl(auVar39);
    auVar98 = ZEXT3264(local_2498);
    auVar38 = vmovshdup_avx(auVar39);
    local_24b8 = vbroadcastsd_avx512vl(auVar38);
    auVar99 = ZEXT3264(local_24b8);
    auVar55 = vshufpd_avx(auVar39,auVar39,1);
    auVar62._8_4_ = 2;
    auVar62._0_8_ = 0x200000002;
    auVar62._12_4_ = 2;
    auVar62._16_4_ = 2;
    auVar62._20_4_ = 2;
    auVar62._24_4_ = 2;
    auVar62._28_4_ = 2;
    local_2398 = vpermps_avx2(auVar62,ZEXT1632(auVar39));
    auVar81 = ZEXT3264(local_2398);
    fVar69 = auVar40._0_4_;
    auVar61._8_4_ = 1;
    auVar61._0_8_ = 0x100000001;
    auVar61._12_4_ = 1;
    auVar61._16_4_ = 1;
    auVar61._20_4_ = 1;
    auVar61._24_4_ = 1;
    auVar61._28_4_ = 1;
    local_23d8 = vpermps_avx2(auVar61,ZEXT1632(auVar40));
    auVar89 = ZEXT3264(local_23d8);
    local_23f8 = vpermps_avx2(auVar62,ZEXT1632(auVar40));
    auVar90 = ZEXT3264(local_23f8);
    uVar12 = (ulong)(auVar39._0_4_ < 0.0);
    uVar28 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
    uVar33 = (ulong)(auVar55._0_4_ < 0.0) << 5 | 0x80;
    uVar32 = uVar12 * 0x20 ^ 0x20;
    uVar76 = auVar41._0_4_;
    local_2418._4_4_ = uVar76;
    local_2418._0_4_ = uVar76;
    local_2418._8_4_ = uVar76;
    local_2418._12_4_ = uVar76;
    local_2418._16_4_ = uVar76;
    local_2418._20_4_ = uVar76;
    local_2418._24_4_ = uVar76;
    local_2418._28_4_ = uVar76;
    auVar91 = ZEXT3264(local_2418);
    uVar76 = auVar37._0_4_;
    auVar74 = ZEXT3264(CONCAT428(uVar76,CONCAT424(uVar76,CONCAT420(uVar76,CONCAT416(uVar76,CONCAT412
                                                  (uVar76,CONCAT48(uVar76,CONCAT44(uVar76,uVar76))))
                                                  ))));
    auVar61 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
    auVar92 = ZEXT3264(auVar61);
    auVar61 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar93 = ZEXT3264(auVar61);
    local_25f8 = context;
    local_23b8 = fVar69;
    fStack_23b4 = fVar69;
    fStack_23b0 = fVar69;
    fStack_23ac = fVar69;
    fStack_23a8 = fVar69;
    fStack_23a4 = fVar69;
    fStack_23a0 = fVar69;
    fStack_239c = fVar69;
    fVar82 = fVar69;
    fVar83 = fVar69;
    fVar84 = fVar69;
    fVar85 = fVar69;
    fVar86 = fVar69;
    fVar87 = fVar69;
LAB_01c63831:
    if (local_2640 != stack) {
      pSVar20 = local_2640 + -1;
      local_2640 = local_2640 + -1;
      if ((float)pSVar20->dist <= auVar75._0_4_) {
        sVar31 = (local_2640->ptr).ptr;
        do {
          while( true ) {
            uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar66._4_4_ = uVar76;
            auVar66._0_4_ = uVar76;
            auVar66._8_4_ = uVar76;
            auVar66._12_4_ = uVar76;
            auVar66._16_4_ = uVar76;
            auVar66._20_4_ = uVar76;
            auVar66._24_4_ = uVar76;
            auVar66._28_4_ = uVar76;
            do {
              if ((sVar31 & 8) != 0) {
                local_25e8 = (ulong)((uint)sVar31 & 0xf) - 8;
                uVar36 = sVar31 & 0xfffffffffffffff0;
                local_25e0 = 0;
                goto LAB_01c63ca5;
              }
              pauVar23 = (undefined1 (*) [32])(sVar31 & 0xfffffffffffffff0);
              auVar41 = vfmadd213ps_fma(pauVar23[uVar12 + 8],auVar66,pauVar23[uVar12 + 2]);
              auVar61 = vsubps_avx512vl(ZEXT1632(auVar41),auVar95._0_32_);
              auVar61 = vmulps_avx512vl(auVar98._0_32_,auVar61);
              auVar61 = vmaxps_avx(auVar91._0_32_,auVar61);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar23[8] + uVar28),auVar66,
                                        *(undefined1 (*) [32])(pauVar23[2] + uVar28));
              auVar62 = vsubps_avx512vl(ZEXT1632(auVar41),auVar96._0_32_);
              auVar62 = vmulps_avx512vl(auVar99._0_32_,auVar62);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar23[8] + uVar33),auVar66,
                                        *(undefined1 (*) [32])(pauVar23[2] + uVar33));
              auVar63 = vsubps_avx512vl(ZEXT1632(auVar41),auVar97._0_32_);
              auVar64._4_4_ = auVar81._4_4_ * auVar63._4_4_;
              auVar64._0_4_ = auVar81._0_4_ * auVar63._0_4_;
              auVar64._8_4_ = auVar81._8_4_ * auVar63._8_4_;
              auVar64._12_4_ = auVar81._12_4_ * auVar63._12_4_;
              auVar64._16_4_ = auVar81._16_4_ * auVar63._16_4_;
              auVar64._20_4_ = auVar81._20_4_ * auVar63._20_4_;
              auVar64._24_4_ = auVar81._24_4_ * auVar63._24_4_;
              auVar64._28_4_ = auVar63._28_4_;
              auVar62 = vmaxps_avx(auVar62,auVar64);
              auVar61 = vmaxps_avx(auVar61,auVar62);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar23[8] + uVar32),auVar66,
                                        *(undefined1 (*) [32])(pauVar23[2] + uVar32));
              auVar62 = vsubps_avx512vl(ZEXT1632(auVar41),auVar95._0_32_);
              auVar63._4_4_ = fVar82 * auVar62._4_4_;
              auVar63._0_4_ = fVar69 * auVar62._0_4_;
              auVar63._8_4_ = fVar83 * auVar62._8_4_;
              auVar63._12_4_ = fVar84 * auVar62._12_4_;
              auVar63._16_4_ = fVar85 * auVar62._16_4_;
              auVar63._20_4_ = fVar86 * auVar62._20_4_;
              auVar63._24_4_ = fVar87 * auVar62._24_4_;
              auVar63._28_4_ = auVar62._28_4_;
              auVar62 = vminps_avx(auVar74._0_32_,auVar63);
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar23[8] + (uVar28 ^ 0x20)),
                                        auVar66,*(undefined1 (*) [32])
                                                 (pauVar23[2] + (uVar28 ^ 0x20)));
              auVar64 = vsubps_avx512vl(ZEXT1632(auVar41),auVar96._0_32_);
              auVar65._4_4_ = auVar89._4_4_ * auVar64._4_4_;
              auVar65._0_4_ = auVar89._0_4_ * auVar64._0_4_;
              auVar65._8_4_ = auVar89._8_4_ * auVar64._8_4_;
              auVar65._12_4_ = auVar89._12_4_ * auVar64._12_4_;
              auVar65._16_4_ = auVar89._16_4_ * auVar64._16_4_;
              auVar65._20_4_ = auVar89._20_4_ * auVar64._20_4_;
              auVar65._24_4_ = auVar89._24_4_ * auVar64._24_4_;
              auVar65._28_4_ = auVar64._28_4_;
              auVar41 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar23[8] + (uVar33 ^ 0x20)),
                                        auVar66,*(undefined1 (*) [32])
                                                 (pauVar23[2] + (uVar33 ^ 0x20)));
              auVar64 = vsubps_avx512vl(ZEXT1632(auVar41),auVar97._0_32_);
              auVar11._4_4_ = auVar90._4_4_ * auVar64._4_4_;
              auVar11._0_4_ = auVar90._0_4_ * auVar64._0_4_;
              auVar11._8_4_ = auVar90._8_4_ * auVar64._8_4_;
              auVar11._12_4_ = auVar90._12_4_ * auVar64._12_4_;
              auVar11._16_4_ = auVar90._16_4_ * auVar64._16_4_;
              auVar11._20_4_ = auVar90._20_4_ * auVar64._20_4_;
              auVar11._24_4_ = auVar90._24_4_ * auVar64._24_4_;
              auVar11._28_4_ = auVar64._28_4_;
              auVar64 = vminps_avx(auVar65,auVar11);
              auVar62 = vminps_avx(auVar62,auVar64);
              uVar36 = vcmpps_avx512vl(auVar61,auVar62,2);
              if (((uint)sVar31 & 7) == 6) {
                uVar26 = vcmpps_avx512vl(auVar66,pauVar23[0xe],0xd);
                uVar16 = vcmpps_avx512vl(auVar66,pauVar23[0xf],1);
                uVar36 = uVar36 & uVar26 & uVar16;
              }
              bVar21 = (byte)uVar36;
              if (bVar21 == 0) {
                auVar41 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                                 ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0))
                ;
                auVar75 = ZEXT1664(auVar41);
                goto LAB_01c63831;
              }
              auVar62 = *pauVar23;
              auVar64 = pauVar23[1];
              auVar63 = vpternlogd_avx512vl(auVar92._0_32_,auVar61,auVar93._0_32_,0xf8);
              auVar65 = vpcompressd_avx512vl(auVar63);
              auVar68._0_4_ =
                   (uint)(bVar21 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar21 & 1) * auVar63._0_4_;
              bVar34 = (bool)((byte)(uVar36 >> 1) & 1);
              auVar68._4_4_ = (uint)bVar34 * auVar65._4_4_ | (uint)!bVar34 * auVar63._4_4_;
              bVar34 = (bool)((byte)(uVar36 >> 2) & 1);
              auVar68._8_4_ = (uint)bVar34 * auVar65._8_4_ | (uint)!bVar34 * auVar63._8_4_;
              bVar34 = (bool)((byte)(uVar36 >> 3) & 1);
              auVar68._12_4_ = (uint)bVar34 * auVar65._12_4_ | (uint)!bVar34 * auVar63._12_4_;
              bVar34 = (bool)((byte)(uVar36 >> 4) & 1);
              auVar68._16_4_ = (uint)bVar34 * auVar65._16_4_ | (uint)!bVar34 * auVar63._16_4_;
              bVar34 = (bool)((byte)(uVar36 >> 5) & 1);
              auVar68._20_4_ = (uint)bVar34 * auVar65._20_4_ | (uint)!bVar34 * auVar63._20_4_;
              bVar34 = (bool)((byte)(uVar36 >> 6) & 1);
              auVar68._24_4_ = (uint)bVar34 * auVar65._24_4_ | (uint)!bVar34 * auVar63._24_4_;
              bVar34 = SUB81(uVar36 >> 7,0);
              auVar68._28_4_ = (uint)bVar34 * auVar65._28_4_ | (uint)!bVar34 * auVar63._28_4_;
              auVar63 = vpermt2q_avx512vl(auVar62,auVar68,auVar64);
              sVar31 = auVar63._0_8_;
              bVar21 = bVar21 - 1 & bVar21;
            } while (bVar21 == 0);
            auVar66 = vpshufd_avx2(auVar68,0x55);
            vpermt2q_avx512vl(auVar62,auVar66,auVar64);
            auVar63 = vpminsd_avx2(auVar68,auVar66);
            auVar66 = vpmaxsd_avx2(auVar68,auVar66);
            bVar21 = bVar21 - 1 & bVar21;
            if (bVar21 != 0) break;
            auVar63 = vpermi2q_avx512vl(auVar63,auVar62,auVar64);
            sVar31 = auVar63._0_8_;
            auVar62 = vpermt2q_avx512vl(auVar62,auVar66,auVar64);
            (local_2640->ptr).ptr = auVar62._0_8_;
            lVar24 = 8;
            lStack_2650 = 0x10;
LAB_01c63a16:
            auVar61 = vpermd_avx2(auVar66,auVar61);
            *(int *)((long)&(local_2640->ptr).ptr + lVar24) = auVar61._0_4_;
            local_2640 = (StackItemT<embree::NodeRefPtr<8>_> *)
                         ((long)&(local_2640->ptr).ptr + lStack_2650);
          }
          auVar11 = vpshufd_avx2(auVar68,0xaa);
          vpermt2q_avx512vl(auVar62,auVar11,auVar64);
          auVar65 = vpminsd_avx2(auVar63,auVar11);
          auVar63 = vpmaxsd_avx2(auVar63,auVar11);
          auVar11 = vpminsd_avx2(auVar66,auVar63);
          auVar63 = vpmaxsd_avx2(auVar66,auVar63);
          bVar21 = bVar21 - 1 & bVar21;
          if (bVar21 == 0) {
            auVar66 = vpermi2q_avx512vl(auVar65,auVar62,auVar64);
            sVar31 = auVar66._0_8_;
            auVar66 = vpermt2q_avx512vl(auVar62,auVar63,auVar64);
            (local_2640->ptr).ptr = auVar66._0_8_;
            auVar66 = vpermd_avx2(auVar63,auVar61);
            local_2640->dist = auVar66._0_4_;
            auVar62 = vpermt2q_avx512vl(auVar62,auVar11,auVar64);
            local_2640[1].ptr.ptr = auVar62._0_8_;
            lStack_2650 = 0x18;
            lVar24 = lStack_2650;
            lStack_2650 = 0x20;
            auVar66 = auVar11;
            goto LAB_01c63a16;
          }
          auVar66 = vpshufd_avx2(auVar68,0xff);
          vpermt2q_avx512vl(auVar62,auVar66,auVar64);
          auVar77 = vpminsd_avx2(auVar65,auVar66);
          auVar65 = vpmaxsd_avx2(auVar65,auVar66);
          auVar66 = vpminsd_avx2(auVar11,auVar65);
          auVar65 = vpmaxsd_avx2(auVar11,auVar65);
          auVar11 = vpminsd_avx2(auVar63,auVar65);
          auVar63 = vpmaxsd_avx2(auVar63,auVar65);
          bVar21 = bVar21 - 1 & bVar21;
          if (bVar21 == 0) {
            auVar65 = vpermi2q_avx512vl(auVar77,auVar62,auVar64);
            sVar31 = auVar65._0_8_;
            auVar65 = vpermt2q_avx512vl(auVar62,auVar63,auVar64);
            (local_2640->ptr).ptr = auVar65._0_8_;
            auVar63 = vpermd_avx2(auVar63,auVar61);
            local_2640->dist = auVar63._0_4_;
            auVar63 = vpermt2q_avx512vl(auVar62,auVar11,auVar64);
            local_2640[1].ptr.ptr = auVar63._0_8_;
            auVar63 = vpermd_avx2(auVar11,auVar61);
            local_2640[1].dist = auVar63._0_4_;
            auVar62 = vpermt2q_avx512vl(auVar62,auVar66,auVar64);
            local_2640[2].ptr.ptr = auVar62._0_8_;
            lVar24 = 0x28;
            lStack_2650 = 0x30;
            goto LAB_01c63a16;
          }
          auVar67 = valignd_avx512vl(auVar68,auVar68,3);
          auVar65 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
          auVar68 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                         CONCAT48(0x80000000,0x8000000080000000))),
                                      auVar65,auVar77);
          auVar65 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
          auVar66 = vpermt2d_avx512vl(auVar68,auVar65,auVar66);
          auVar65 = vpermt2d_avx512vl(auVar66,auVar65,auVar11);
          auVar66 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
          auVar66 = vpermt2d_avx512vl(auVar65,auVar66,auVar63);
          auVar75 = ZEXT3264(auVar66);
          bVar25 = bVar21;
          do {
            auVar63 = auVar75._0_32_;
            auVar77._8_4_ = 1;
            auVar77._0_8_ = 0x100000001;
            auVar77._12_4_ = 1;
            auVar77._16_4_ = 1;
            auVar77._20_4_ = 1;
            auVar77._24_4_ = 1;
            auVar77._28_4_ = 1;
            auVar66 = vpermd_avx2(auVar77,auVar67);
            auVar67 = valignd_avx512vl(auVar67,auVar67,1);
            vpermt2q_avx512vl(auVar62,auVar67,auVar64);
            bVar25 = bVar25 - 1 & bVar25;
            uVar17 = vpcmpd_avx512vl(auVar66,auVar63,5);
            auVar66 = vpmaxsd_avx2(auVar66,auVar63);
            bVar18 = (byte)uVar17 << 1;
            auVar63 = valignd_avx512vl(auVar63,auVar63,7);
            bVar34 = (bool)((byte)uVar17 & 1);
            bVar6 = (bool)(bVar18 >> 2 & 1);
            bVar7 = (bool)(bVar18 >> 3 & 1);
            bVar8 = (bool)(bVar18 >> 4 & 1);
            bVar9 = (bool)(bVar18 >> 5 & 1);
            bVar10 = (bool)(bVar18 >> 6 & 1);
            auVar75 = ZEXT3264(CONCAT428((uint)(bVar18 >> 7) * auVar63._28_4_ |
                                         (uint)!(bool)(bVar18 >> 7) * auVar66._28_4_,
                                         CONCAT424((uint)bVar10 * auVar63._24_4_ |
                                                   (uint)!bVar10 * auVar66._24_4_,
                                                   CONCAT420((uint)bVar9 * auVar63._20_4_ |
                                                             (uint)!bVar9 * auVar66._20_4_,
                                                             CONCAT416((uint)bVar8 * auVar63._16_4_
                                                                       | (uint)!bVar8 *
                                                                         auVar66._16_4_,
                                                                       CONCAT412((uint)bVar7 *
                                                                                 auVar63._12_4_ |
                                                                                 (uint)!bVar7 *
                                                                                 auVar66._12_4_,
                                                                                 CONCAT48((uint)
                                                  bVar6 * auVar63._8_4_ |
                                                  (uint)!bVar6 * auVar66._8_4_,
                                                  CONCAT44((uint)bVar34 * auVar63._4_4_ |
                                                           (uint)!bVar34 * auVar66._4_4_,
                                                           auVar66._0_4_))))))));
          } while (bVar25 != 0);
          lVar24 = (ulong)(uint)POPCOUNT((uint)bVar21) + 3;
          while( true ) {
            auVar63 = auVar75._0_32_;
            auVar66 = vpermt2q_avx512vl(auVar62,auVar63,auVar64);
            sVar31 = auVar66._0_8_;
            bVar34 = lVar24 == 0;
            lVar24 = lVar24 + -1;
            if (bVar34) break;
            (local_2640->ptr).ptr = sVar31;
            auVar66 = vpermd_avx2(auVar63,auVar61);
            local_2640->dist = auVar66._0_4_;
            auVar66 = valignd_avx512vl(auVar63,auVar63,1);
            auVar75 = ZEXT3264(auVar66);
            local_2640 = local_2640 + 1;
          }
          auVar41 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar94 = ZEXT1664(auVar41);
          auVar95 = ZEXT3264(local_2438);
          auVar96 = ZEXT3264(local_2458);
          auVar97 = ZEXT3264(local_2478);
          auVar98 = ZEXT3264(local_2498);
          auVar99 = ZEXT3264(local_24b8);
        } while( true );
      }
      goto LAB_01c63831;
    }
  }
  return;
LAB_01c63ca5:
  if (local_25e0 == local_25e8) goto LAB_01c64570;
  lVar24 = local_25e0 * 0x140;
  uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
  auVar49._4_4_ = uVar76;
  auVar49._0_4_ = uVar76;
  auVar49._8_4_ = uVar76;
  auVar49._12_4_ = uVar76;
  auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x90 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + lVar24));
  auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0xa0 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x10 + lVar24));
  auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0xb0 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x20 + lVar24));
  auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0xc0 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x30 + lVar24));
  auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0xd0 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x40 + lVar24));
  auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0xe0 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x50 + lVar24));
  auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0xf0 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x60 + lVar24));
  auVar48 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x100 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x70 + lVar24));
  auVar49 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x110 + lVar24),auVar49,
                            *(undefined1 (*) [16])(uVar36 + 0x80 + lVar24));
  uVar76 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar50._4_4_ = uVar76;
  auVar50._0_4_ = uVar76;
  auVar50._8_4_ = uVar76;
  auVar50._12_4_ = uVar76;
  auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
  auVar43 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
  uVar76 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  auVar78._4_4_ = uVar76;
  auVar78._0_4_ = uVar76;
  auVar78._8_4_ = uVar76;
  auVar78._12_4_ = uVar76;
  uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  auVar79._4_4_ = uVar76;
  auVar79._0_4_ = uVar76;
  auVar79._8_4_ = uVar76;
  auVar79._12_4_ = uVar76;
  fVar82 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar80._4_4_ = fVar82;
  auVar80._0_4_ = fVar82;
  auVar80._8_4_ = fVar82;
  auVar80._12_4_ = fVar82;
  auVar41 = vsubps_avx(auVar41,auVar50);
  auVar44 = vsubps_avx512vl(auVar37,auVar42);
  auVar45 = vsubps_avx512vl(auVar38,auVar43);
  auVar46 = vsubps_avx512vl(auVar55,auVar50);
  auVar40 = vsubps_avx512vl(auVar40,auVar42);
  auVar47 = vsubps_avx512vl(auVar47,auVar43);
  auVar39 = vsubps_avx512vl(auVar39,auVar50);
  auVar48 = vsubps_avx512vl(auVar48,auVar42);
  auVar49 = vsubps_avx512vl(auVar49,auVar43);
  auVar42 = vsubps_avx512vl(auVar39,auVar41);
  auVar43 = vsubps_avx512vl(auVar48,auVar44);
  auVar37 = vsubps_avx(auVar49,auVar45);
  auVar50 = vsubps_avx512vl(auVar41,auVar46);
  auVar51 = vsubps_avx512vl(auVar44,auVar40);
  auVar52 = vsubps_avx512vl(auVar45,auVar47);
  auVar53 = vsubps_avx512vl(auVar46,auVar39);
  auVar54 = vsubps_avx512vl(auVar40,auVar48);
  auVar38 = vsubps_avx(auVar47,auVar49);
  auVar55 = vaddps_avx512vl(auVar39,auVar41);
  auVar56 = vaddps_avx512vl(auVar48,auVar44);
  auVar57 = vaddps_avx512vl(auVar49,auVar45);
  auVar58 = vmulps_avx512vl(auVar56,auVar37);
  auVar58 = vfmsub231ps_avx512vl(auVar58,auVar43,auVar57);
  auVar57 = vmulps_avx512vl(auVar57,auVar42);
  auVar57 = vfmsub231ps_avx512vl(auVar57,auVar37,auVar55);
  auVar59._0_4_ = auVar43._0_4_ * auVar55._0_4_;
  auVar59._4_4_ = auVar43._4_4_ * auVar55._4_4_;
  auVar59._8_4_ = auVar43._8_4_ * auVar55._8_4_;
  auVar59._12_4_ = auVar43._12_4_ * auVar55._12_4_;
  auVar55 = vfmsub231ps_fma(auVar59,auVar42,auVar56);
  auVar56._0_4_ = fVar82 * auVar55._0_4_;
  auVar56._4_4_ = fVar82 * auVar55._4_4_;
  auVar56._8_4_ = fVar82 * auVar55._8_4_;
  auVar56._12_4_ = fVar82 * auVar55._12_4_;
  auVar55 = vfmadd231ps_avx512vl(auVar56,auVar79,auVar57);
  auVar56 = vfmadd231ps_avx512vl(auVar55,auVar78,auVar58);
  auVar55 = vaddps_avx512vl(auVar41,auVar46);
  auVar57 = vaddps_avx512vl(auVar44,auVar40);
  auVar58 = vaddps_avx512vl(auVar45,auVar47);
  auVar59 = vmulps_avx512vl(auVar57,auVar52);
  auVar59 = vfmsub231ps_avx512vl(auVar59,auVar51,auVar58);
  auVar58 = vmulps_avx512vl(auVar58,auVar50);
  auVar58 = vfmsub231ps_avx512vl(auVar58,auVar52,auVar55);
  auVar55 = vmulps_avx512vl(auVar55,auVar51);
  auVar55 = vfmsub231ps_avx512vl(auVar55,auVar50,auVar57);
  auVar57._0_4_ = fVar82 * auVar55._0_4_;
  auVar57._4_4_ = fVar82 * auVar55._4_4_;
  auVar57._8_4_ = fVar82 * auVar55._8_4_;
  auVar57._12_4_ = fVar82 * auVar55._12_4_;
  auVar55 = vfmadd231ps_avx512vl(auVar57,auVar79,auVar58);
  auVar57 = vfmadd231ps_avx512vl(auVar55,auVar78,auVar59);
  auVar39 = vaddps_avx512vl(auVar46,auVar39);
  auVar40 = vaddps_avx512vl(auVar40,auVar48);
  auVar46._0_4_ = auVar47._0_4_ + auVar49._0_4_;
  auVar46._4_4_ = auVar47._4_4_ + auVar49._4_4_;
  auVar46._8_4_ = auVar47._8_4_ + auVar49._8_4_;
  auVar46._12_4_ = auVar47._12_4_ + auVar49._12_4_;
  auVar55 = vmulps_avx512vl(auVar40,auVar38);
  auVar55 = vfmsub231ps_fma(auVar55,auVar54,auVar46);
  auVar58._0_4_ = auVar46._0_4_ * auVar53._0_4_;
  auVar58._4_4_ = auVar46._4_4_ * auVar53._4_4_;
  auVar58._8_4_ = auVar46._8_4_ * auVar53._8_4_;
  auVar58._12_4_ = auVar46._12_4_ * auVar53._12_4_;
  auVar47 = vfmsub231ps_avx512vl(auVar58,auVar38,auVar39);
  auVar39 = vmulps_avx512vl(auVar39,auVar54);
  auVar40 = vfmsub231ps_avx512vl(auVar39,auVar53,auVar40);
  auVar40 = vmulps_avx512vl(auVar80,auVar40);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar79,auVar47);
  auVar55 = vfmadd231ps_avx512vl(auVar40,auVar78,auVar55);
  auVar88._0_4_ = auVar56._0_4_ + auVar57._0_4_;
  auVar88._4_4_ = auVar56._4_4_ + auVar57._4_4_;
  auVar88._8_4_ = auVar56._8_4_ + auVar57._8_4_;
  auVar88._12_4_ = auVar56._12_4_ + auVar57._12_4_;
  auVar40 = vaddps_avx512vl(auVar55,auVar88);
  auVar39._8_4_ = 0x7fffffff;
  auVar39._0_8_ = 0x7fffffff7fffffff;
  auVar39._12_4_ = 0x7fffffff;
  auVar47 = vandps_avx512vl(auVar40,auVar39);
  auVar48._8_4_ = 0x34000000;
  auVar48._0_8_ = 0x3400000034000000;
  auVar48._12_4_ = 0x34000000;
  auVar39 = vmulps_avx512vl(auVar47,auVar48);
  auVar48 = vminps_avx512vl(auVar56,auVar57);
  auVar48 = vminps_avx512vl(auVar48,auVar55);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar49 = vxorps_avx512vl(auVar39,auVar49);
  uVar17 = vcmpps_avx512vl(auVar48,auVar49,5);
  auVar48 = vmaxps_avx512vl(auVar56,auVar57);
  auVar55 = vmaxps_avx512vl(auVar48,auVar55);
  uVar13 = vcmpps_avx512vl(auVar55,auVar39,2);
  bVar21 = ((byte)uVar17 | (byte)uVar13) & 0xf;
  if (bVar21 != 0) {
    auVar55 = vmulps_avx512vl(auVar37,auVar51);
    auVar39 = vmulps_avx512vl(auVar42,auVar52);
    auVar48 = vmulps_avx512vl(auVar43,auVar50);
    auVar49 = vmulps_avx512vl(auVar52,auVar54);
    auVar46 = vmulps_avx512vl(auVar50,auVar38);
    auVar58 = vmulps_avx512vl(auVar51,auVar53);
    auVar43 = vfmsub213ps_avx512vl(auVar43,auVar52,auVar55);
    auVar37 = vfmsub213ps_avx512vl(auVar37,auVar50,auVar39);
    auVar42 = vfmsub213ps_avx512vl(auVar42,auVar51,auVar48);
    auVar38 = vfmsub213ps_avx512vl(auVar38,auVar51,auVar49);
    auVar51 = vfmsub213ps_avx512vl(auVar53,auVar52,auVar46);
    auVar50 = vfmsub213ps_avx512vl(auVar54,auVar50,auVar58);
    auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar55 = vandps_avx512vl(auVar55,auVar52);
    auVar49 = vandps_avx512vl(auVar49,auVar52);
    uVar26 = vcmpps_avx512vl(auVar55,auVar49,1);
    auVar55 = vandps_avx512vl(auVar39,auVar52);
    auVar39 = vandps_avx512vl(auVar46,auVar52);
    uVar16 = vcmpps_avx512vl(auVar55,auVar39,1);
    auVar55 = vandps_avx512vl(auVar48,auVar52);
    auVar39 = vandps_avx512vl(auVar58,auVar52);
    uVar14 = vcmpps_avx512vl(auVar55,auVar39,1);
    bVar34 = (bool)((byte)uVar26 & 1);
    local_24e8._0_4_ = (uint)bVar34 * auVar43._0_4_ | (uint)!bVar34 * auVar38._0_4_;
    bVar34 = (bool)((byte)(uVar26 >> 1) & 1);
    local_24e8._4_4_ = (uint)bVar34 * auVar43._4_4_ | (uint)!bVar34 * auVar38._4_4_;
    bVar34 = (bool)((byte)(uVar26 >> 2) & 1);
    local_24e8._8_4_ = (uint)bVar34 * auVar43._8_4_ | (uint)!bVar34 * auVar38._8_4_;
    bVar34 = (bool)((byte)(uVar26 >> 3) & 1);
    local_24e8._12_4_ = (uint)bVar34 * auVar43._12_4_ | (uint)!bVar34 * auVar38._12_4_;
    bVar34 = (bool)((byte)uVar16 & 1);
    local_24d8._0_4_ = (uint)bVar34 * auVar37._0_4_ | (uint)!bVar34 * auVar51._0_4_;
    bVar34 = (bool)((byte)(uVar16 >> 1) & 1);
    local_24d8._4_4_ = (uint)bVar34 * auVar37._4_4_ | (uint)!bVar34 * auVar51._4_4_;
    bVar34 = (bool)((byte)(uVar16 >> 2) & 1);
    local_24d8._8_4_ = (uint)bVar34 * auVar37._8_4_ | (uint)!bVar34 * auVar51._8_4_;
    bVar34 = (bool)((byte)(uVar16 >> 3) & 1);
    local_24d8._12_4_ = (uint)bVar34 * auVar37._12_4_ | (uint)!bVar34 * auVar51._12_4_;
    bVar34 = (bool)((byte)uVar14 & 1);
    local_24c8[0] = (float)((uint)bVar34 * auVar42._0_4_ | (uint)!bVar34 * auVar50._0_4_);
    bVar34 = (bool)((byte)(uVar14 >> 1) & 1);
    local_24c8[1] = (float)((uint)bVar34 * auVar42._4_4_ | (uint)!bVar34 * auVar50._4_4_);
    bVar34 = (bool)((byte)(uVar14 >> 2) & 1);
    local_24c8[2] = (float)((uint)bVar34 * auVar42._8_4_ | (uint)!bVar34 * auVar50._8_4_);
    bVar34 = (bool)((byte)(uVar14 >> 3) & 1);
    local_24c8[3] = (float)((uint)bVar34 * auVar42._12_4_ | (uint)!bVar34 * auVar50._12_4_);
    auVar53._0_4_ = fVar82 * local_24c8[0];
    auVar53._4_4_ = fVar82 * local_24c8[1];
    auVar53._8_4_ = fVar82 * local_24c8[2];
    auVar53._12_4_ = fVar82 * local_24c8[3];
    auVar37 = vfmadd213ps_fma(auVar79,local_24d8,auVar53);
    auVar37 = vfmadd213ps_fma(auVar78,local_24e8,auVar37);
    auVar51._0_4_ = auVar37._0_4_ + auVar37._0_4_;
    auVar51._4_4_ = auVar37._4_4_ + auVar37._4_4_;
    auVar51._8_4_ = auVar37._8_4_ + auVar37._8_4_;
    auVar51._12_4_ = auVar37._12_4_ + auVar37._12_4_;
    auVar52._0_4_ = auVar45._0_4_ * local_24c8[0];
    auVar52._4_4_ = auVar45._4_4_ * local_24c8[1];
    auVar52._8_4_ = auVar45._8_4_ * local_24c8[2];
    auVar52._12_4_ = auVar45._12_4_ * local_24c8[3];
    auVar37 = vfmadd213ps_fma(auVar44,local_24d8,auVar52);
    auVar37 = vfmadd213ps_fma(auVar41,local_24e8,auVar37);
    auVar41 = vrcp14ps_avx512vl(auVar51);
    auVar55 = auVar94._0_16_;
    auVar38 = vfnmadd213ps_avx512vl(auVar41,auVar51,auVar55);
    auVar41 = vfmadd132ps_fma(auVar38,auVar41,auVar41);
    local_24f8._0_4_ = auVar41._0_4_ * (auVar37._0_4_ + auVar37._0_4_);
    local_24f8._4_4_ = auVar41._4_4_ * (auVar37._4_4_ + auVar37._4_4_);
    local_24f8._8_4_ = auVar41._8_4_ * (auVar37._8_4_ + auVar37._8_4_);
    local_24f8._12_4_ = auVar41._12_4_ * (auVar37._12_4_ + auVar37._12_4_);
    auVar74 = ZEXT1664(local_24f8);
    uVar76 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar41._4_4_ = uVar76;
    auVar41._0_4_ = uVar76;
    auVar41._8_4_ = uVar76;
    auVar41._12_4_ = uVar76;
    uVar17 = vcmpps_avx512vl(local_24f8,auVar41,0xd);
    uVar26 = CONCAT44(auVar51._4_4_,auVar51._0_4_);
    auVar43._0_8_ = uVar26 ^ 0x8000000080000000;
    auVar43._8_4_ = -auVar51._8_4_;
    auVar43._12_4_ = -auVar51._12_4_;
    fVar82 = (ray->super_RayK<1>).tfar;
    auVar42._4_4_ = fVar82;
    auVar42._0_4_ = fVar82;
    auVar42._8_4_ = fVar82;
    auVar42._12_4_ = fVar82;
    uVar13 = vcmpps_avx512vl(local_24f8,auVar42,2);
    uVar15 = vcmpps_avx512vl(auVar51,auVar43,4);
    bVar21 = (byte)uVar17 & (byte)uVar13 & (byte)uVar15 & bVar21;
    uVar35 = (uint)bVar21;
    if (bVar21 != 0) {
      auVar44._0_4_ = (ray->super_RayK<1>).tfar;
      auVar44._4_4_ = (ray->super_RayK<1>).mask;
      auVar44._8_4_ = (ray->super_RayK<1>).id;
      auVar44._12_4_ = (ray->super_RayK<1>).flags;
      auVar75 = ZEXT1664(auVar44);
      uVar22 = vextractps_avx(auVar44,1);
      lVar24 = lVar24 + uVar36;
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      uVar26 = vcmpps_avx512vl(auVar47,auVar45,5);
      auVar41 = vrcp14ps_avx512vl(auVar40);
      auVar37 = vfnmadd213ps_avx512vl(auVar40,auVar41,auVar55);
      auVar41 = vfmadd132ps_avx512vl(auVar37,auVar41,auVar41);
      fVar82 = (float)((uint)((byte)uVar26 & 1) * auVar41._0_4_);
      fVar83 = (float)((uint)((byte)(uVar26 >> 1) & 1) * auVar41._4_4_);
      fVar84 = (float)((uint)((byte)(uVar26 >> 2) & 1) * auVar41._8_4_);
      fVar85 = (float)((uint)((byte)(uVar26 >> 3) & 1) * auVar41._12_4_);
      auVar70._0_4_ = fVar82 * auVar56._0_4_;
      auVar70._4_4_ = fVar83 * auVar56._4_4_;
      auVar70._8_4_ = fVar84 * auVar56._8_4_;
      auVar70._12_4_ = fVar85 * auVar56._12_4_;
      local_2518 = vminps_avx512vl(auVar70,auVar55);
      auVar71._0_4_ = fVar82 * auVar57._0_4_;
      auVar71._4_4_ = fVar83 * auVar57._4_4_;
      auVar71._8_4_ = fVar84 * auVar57._8_4_;
      auVar71._12_4_ = fVar85 * auVar57._12_4_;
      local_2508 = vminps_avx512vl(auVar71,auVar55);
      pSVar4 = local_25f8->scene;
      auVar72._8_4_ = 0x7f800000;
      auVar72._0_8_ = 0x7f8000007f800000;
      auVar72._12_4_ = 0x7f800000;
      auVar41 = vblendmps_avx512vl(auVar72,local_24f8);
      auVar54._0_4_ = (uint)(bVar21 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
      bVar34 = (bool)(bVar21 >> 1 & 1);
      auVar54._4_4_ = (uint)bVar34 * auVar41._4_4_ | (uint)!bVar34 * 0x7f800000;
      bVar34 = (bool)(bVar21 >> 2 & 1);
      auVar54._8_4_ = (uint)bVar34 * auVar41._8_4_ | (uint)!bVar34 * 0x7f800000;
      auVar54._12_4_ =
           (uint)(bVar21 >> 3) * auVar41._12_4_ | (uint)!(bool)(bVar21 >> 3) * 0x7f800000;
      auVar41 = vshufps_avx(auVar54,auVar54,0xb1);
      auVar41 = vminps_avx(auVar41,auVar54);
      auVar37 = vshufpd_avx(auVar41,auVar41,1);
      auVar41 = vminps_avx(auVar37,auVar41);
      uVar17 = vcmpps_avx512vl(auVar54,auVar41,0);
      uVar29 = uVar35;
      if (((byte)uVar17 & bVar21) != 0) {
        uVar29 = (uint)((byte)uVar17 & bVar21);
      }
      uVar27 = 0;
      for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
        uVar27 = uVar27 + 1;
      }
      do {
        uVar29 = uVar27 & 0xff;
        h.geomID = *(uint *)(lVar24 + 0x120 + (ulong)uVar29 * 4);
        pGVar5 = (pSVar4->geometries).items[h.geomID].ptr;
        if ((pGVar5->mask & uVar22) == 0) {
          bVar21 = ~(byte)(1 << (uVar27 & 0x1f)) & (byte)uVar35;
        }
        else {
          pRVar30 = local_25f8->args;
          if (pRVar30->filter == (RTCFilterFunctionN)0x0) {
            args.context = local_25f8->user;
            if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
              uVar26 = (ulong)(uVar29 << 2);
              fVar82 = *(float *)(local_2518 + uVar26);
              fVar83 = *(float *)(local_2508 + uVar26);
              (ray->super_RayK<1>).tfar = *(float *)(local_24f8 + uVar26);
              (ray->Ng).field_0.field_0.x = *(float *)(local_24e8 + uVar26);
              (ray->Ng).field_0.field_0.y = *(float *)(local_24d8 + uVar26);
              (ray->Ng).field_0.field_0.z = *(float *)((long)local_24c8 + uVar26);
              ray->u = fVar82;
              ray->v = fVar83;
              ray->primID = *(uint *)(lVar24 + 0x130 + uVar26);
              ray->geomID = h.geomID;
              ray->instID[0] = (args.context)->instID[0];
              ray->instPrimID[0] = (args.context)->instPrimID[0];
              break;
            }
          }
          else {
            args.context = local_25f8->user;
          }
          uVar26 = (ulong)(uVar29 * 4);
          h.Ng.field_0.field_0.x = *(float *)(local_24e8 + uVar26);
          h.Ng.field_0.field_0.y = *(float *)(local_24d8 + uVar26);
          h.Ng.field_0.field_0.z = *(float *)((long)local_24c8 + uVar26);
          h.u = *(float *)(local_2518 + uVar26);
          h.v = *(float *)(local_2508 + uVar26);
          h.primID = *(uint *)(lVar24 + 0x130 + uVar26);
          h.instID[0] = (args.context)->instID[0];
          h.instPrimID[0] = (args.context)->instPrimID[0];
          (ray->super_RayK<1>).tfar = *(float *)(local_24f8 + uVar26);
          local_2604 = -1;
          args.valid = &local_2604;
          args.geometryUserPtr = pGVar5->userPtr;
          args.ray = (RTCRayN *)ray;
          args.hit = (RTCHitN *)&h;
          args.N = 1;
          auVar41 = auVar74._0_16_;
          local_2600 = (ulong)uVar29;
          if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c64397:
            if ((pRVar30->filter != (RTCFilterFunctionN)0x0) &&
               (((pRVar30->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*pRVar30->filter)(&args);
              uVar29 = (uint)local_2600;
              auVar74 = ZEXT1664(auVar41);
              auVar99 = ZEXT3264(local_24b8);
              auVar98 = ZEXT3264(local_2498);
              auVar97 = ZEXT3264(local_2478);
              auVar96 = ZEXT3264(local_2458);
              auVar95 = ZEXT3264(local_2438);
              auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar94 = ZEXT1664(auVar37);
              if (*args.valid == 0) goto LAB_01c64479;
            }
            *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
            *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
            *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
            *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
            *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
            *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
            *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
            *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
            *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
          }
          else {
            local_25f0 = pRVar30;
            (*pGVar5->intersectionFilterN)(&args);
            uVar29 = (uint)local_2600;
            auVar74 = ZEXT1664(auVar41);
            auVar99 = ZEXT3264(local_24b8);
            auVar98 = ZEXT3264(local_2498);
            auVar97 = ZEXT3264(local_2478);
            auVar96 = ZEXT3264(local_2458);
            auVar95 = ZEXT3264(local_2438);
            auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar94 = ZEXT1664(auVar37);
            pRVar30 = local_25f0;
            if (*args.valid != 0) goto LAB_01c64397;
LAB_01c64479:
            auVar74 = ZEXT1664(auVar41);
            local_2578 = auVar75._0_4_;
            (ray->super_RayK<1>).tfar = local_2578;
          }
          auVar3._0_4_ = (ray->super_RayK<1>).tfar;
          auVar3._4_4_ = (ray->super_RayK<1>).mask;
          auVar3._8_4_ = (ray->super_RayK<1>).id;
          auVar3._12_4_ = (ray->super_RayK<1>).flags;
          auVar75 = ZEXT1664(auVar3);
          fVar82 = (ray->super_RayK<1>).tfar;
          auVar19._4_4_ = fVar82;
          auVar19._0_4_ = fVar82;
          auVar19._8_4_ = fVar82;
          auVar19._12_4_ = fVar82;
          uVar17 = vcmpps_avx512vl(auVar74._0_16_,auVar19,2);
          bVar21 = ~(byte)(1 << (uVar29 & 0x1f)) & (byte)uVar35 & (byte)uVar17;
          uVar22 = vextractps_avx(auVar3,1);
        }
        uVar35 = (uint)bVar21;
        if (bVar21 == 0) break;
        auVar73._8_4_ = 0x7f800000;
        auVar73._0_8_ = 0x7f8000007f800000;
        auVar73._12_4_ = 0x7f800000;
        auVar41 = vblendmps_avx512vl(auVar73,auVar74._0_16_);
        auVar60._0_4_ = (uint)(bVar21 & 1) * auVar41._0_4_ | (uint)!(bool)(bVar21 & 1) * 0x7f800000;
        bVar34 = (bool)(bVar21 >> 1 & 1);
        auVar60._4_4_ = (uint)bVar34 * auVar41._4_4_ | (uint)!bVar34 * 0x7f800000;
        bVar34 = (bool)(bVar21 >> 2 & 1);
        auVar60._8_4_ = (uint)bVar34 * auVar41._8_4_ | (uint)!bVar34 * 0x7f800000;
        auVar60._12_4_ =
             (uint)(bVar21 >> 3) * auVar41._12_4_ | (uint)!(bool)(bVar21 >> 3) * 0x7f800000;
        auVar41 = vshufps_avx(auVar60,auVar60,0xb1);
        auVar41 = vminps_avx(auVar41,auVar60);
        auVar37 = vshufpd_avx(auVar41,auVar41,1);
        auVar41 = vminps_avx(auVar37,auVar41);
        uVar17 = vcmpps_avx512vl(auVar60,auVar41,0);
        bVar21 = (byte)uVar17 & bVar21;
        uVar29 = uVar35;
        if (bVar21 != 0) {
          uVar29 = (uint)bVar21;
        }
        uVar27 = 0;
        for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
          uVar27 = uVar27 + 1;
        }
      } while( true );
    }
  }
  local_25e0 = local_25e0 + 1;
  auVar81 = ZEXT3264(local_2398);
  auVar89 = ZEXT3264(local_23d8);
  auVar90 = ZEXT3264(local_23f8);
  auVar91 = ZEXT3264(local_2418);
  fVar69 = local_23b8;
  fVar82 = fStack_23b4;
  fVar83 = fStack_23b0;
  fVar84 = fStack_23ac;
  fVar85 = fStack_23a8;
  fVar86 = fStack_23a4;
  fVar87 = fStack_23a0;
  goto LAB_01c63ca5;
LAB_01c64570:
  fVar1 = (ray->super_RayK<1>).tfar;
  auVar74 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  auVar75 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
  auVar61 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
  auVar92 = ZEXT3264(auVar61);
  auVar61 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar93 = ZEXT3264(auVar61);
  goto LAB_01c63831;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }